

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

FrameOpResult __thiscall QRhiGles2::endOffscreenFrame(QRhiGles2 *this,EndFrameFlags flags)

{
  GLuint GVar1;
  bool bVar2;
  quint64 nanoseconds;
  Command *pCVar3;
  long lVar4;
  FrameOpResult FVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 *local_38;
  undefined1 *apuStack_30 [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ofr).active = false;
  GVar1 = (this->ofr).tsQueries[1];
  pCVar3 = QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::get
                     (&(this->ofr).cbWrapper.commands);
  pCVar3->cmd = EndFrame;
  (pCVar3->args).beginFrame.timestampQuery = GVar1;
  FVar5 = FrameOpSuccess;
  bVar2 = ensureContext(this,(QSurface *)0x0);
  if (bVar2) {
    executeCommandBuffer(this,&(this->ofr).cbWrapper.super_QRhiCommandBuffer);
    (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
      [0x13])();
    if ((this->ofr).tsQueries[0] != 0) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      apuStack_30[0] = &DAT_aaaaaaaaaaaaaaaa;
      (*this->glGetQueryObjectui64v)((this->ofr).tsQueries[1],0x8866,(quint64 *)apuStack_30);
      (*this->glGetQueryObjectui64v)((this->ofr).tsQueries[0],0x8866,(quint64 *)&local_38);
      lVar4 = (long)apuStack_30[0] - (long)local_38;
      if (local_38 <= apuStack_30[0]) {
        auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
        auVar6._0_8_ = lVar4;
        auVar6._12_4_ = 0x45300000;
        (this->ofr).cbWrapper.lastGpuTime =
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 1000000000.0;
      }
    }
  }
  else {
    FVar5 = (uint)this->contextLost * 2 + FrameOpError;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return FVar5;
  }
  __stack_chk_fail();
}

Assistant:

QRhi::FrameOpResult QRhiGles2::endOffscreenFrame(QRhi::EndFrameFlags flags)
{
    Q_UNUSED(flags);
    Q_ASSERT(ofr.active);
    ofr.active = false;

    addBoundaryCommand(&ofr.cbWrapper, QGles2CommandBuffer::Command::EndFrame, ofr.tsQueries[1]);

    if (!ensureContext())
        return contextLost ? QRhi::FrameOpDeviceLost : QRhi::FrameOpError;

    executeCommandBuffer(&ofr.cbWrapper);

    // Just as endFrame() does a flush when skipping the swapBuffers(), do it
    // here as well. This has the added benefit of playing nice when rendering
    // to a texture from a context and then consuming that texture from
    // another, sharing context.
    f->glFlush();

    if (ofr.tsQueries[0]) {
        quint64 timestamps[2];
        glGetQueryObjectui64v(ofr.tsQueries[1], GL_QUERY_RESULT, &timestamps[1]);
        glGetQueryObjectui64v(ofr.tsQueries[0], GL_QUERY_RESULT, &timestamps[0]);
        if (timestamps[1] >= timestamps[0]) {
            const quint64 nanoseconds = timestamps[1] - timestamps[0];
            ofr.cbWrapper.lastGpuTime = nanoseconds / 1000000000.0; // seconds
        }
    }

    return QRhi::FrameOpSuccess;
}